

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

void __thiscall
CS248::DynamicScene::Skeleton::saveJoint
          (Skeleton *this,XMLDocument *xmlDoc,XMLElement *parentNode,Joint *joint)

{
  bool bVar1;
  Joint *joint_00;
  reference ppJVar2;
  XMLElement *in_RCX;
  XMLDocument *in_RDX;
  Skeleton *in_RSI;
  map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
  *in_RDI;
  Joint *j;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_> *__range2_3;
  XMLElement *pChildren;
  XMLElement *pListElement_2;
  pair<const_double,_CS248::Vector3D> *item_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
  *__range2_2;
  XMLElement *pListElement_1;
  pair<const_double,_CS248::Vector3D> *item_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
  *__range2_1;
  XMLElement *pListElement;
  pair<const_double,_CS248::Vector3D> *item;
  const_iterator __end2;
  const_iterator __begin2;
  map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
  *__range2;
  XMLElement *pElement;
  XMLElement *pJoint;
  Joint *in_stack_ffffffffffffff30;
  XMLNode *in_stack_ffffffffffffff38;
  __normal_iterator<CS248::DynamicScene::Joint_*const_*,_std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>_>
  in_stack_ffffffffffffff40;
  _Self local_98;
  _Self local_90;
  MemPool **local_88;
  XMLElement *local_80;
  reference local_78;
  _Self local_70;
  _Self local_68;
  char **local_60;
  XMLElement *local_58;
  reference local_50;
  _Self local_48;
  _Self local_40;
  int *local_38;
  XMLElement *local_30;
  
  joint_00 = (Joint *)tinyxml2::XMLDocument::NewElement
                                ((XMLDocument *)in_stack_ffffffffffffff40._M_current,
                                 (char *)in_stack_ffffffffffffff38);
  tinyxml2::XMLNode::InsertEndChild(in_stack_ffffffffffffff38,(XMLNode *)in_stack_ffffffffffffff30);
  local_30 = tinyxml2::XMLDocument::NewElement
                       ((XMLDocument *)in_stack_ffffffffffffff40._M_current,
                        (char *)in_stack_ffffffffffffff38);
  tinyxml2::XMLElement::SetAttribute
            ((XMLElement *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38,
             (double)in_stack_ffffffffffffff30);
  tinyxml2::XMLElement::SetAttribute
            ((XMLElement *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38,
             (double)in_stack_ffffffffffffff30);
  tinyxml2::XMLElement::SetAttribute
            ((XMLElement *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38,
             (double)in_stack_ffffffffffffff30);
  tinyxml2::XMLNode::InsertEndChild(in_stack_ffffffffffffff38,(XMLNode *)in_stack_ffffffffffffff30);
  local_30 = tinyxml2::XMLDocument::NewElement
                       ((XMLDocument *)in_stack_ffffffffffffff40._M_current,
                        (char *)in_stack_ffffffffffffff38);
  tinyxml2::XMLElement::SetAttribute
            ((XMLElement *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38,
             (double)in_stack_ffffffffffffff30);
  tinyxml2::XMLNode::InsertEndChild(in_stack_ffffffffffffff38,(XMLNode *)in_stack_ffffffffffffff30);
  local_30 = tinyxml2::XMLDocument::NewElement
                       ((XMLDocument *)in_stack_ffffffffffffff40._M_current,
                        (char *)in_stack_ffffffffffffff38);
  tinyxml2::XMLElement::SetAttribute
            ((XMLElement *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38,
             (double)in_stack_ffffffffffffff30);
  tinyxml2::XMLNode::InsertEndChild(in_stack_ffffffffffffff38,(XMLNode *)in_stack_ffffffffffffff30);
  local_30 = tinyxml2::XMLDocument::NewElement
                       ((XMLDocument *)in_stack_ffffffffffffff40._M_current,
                        (char *)in_stack_ffffffffffffff38);
  local_38 = &in_RCX->_closingType;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
       ::begin(in_RDI);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
       ::end(in_RDI);
  while( true ) {
    bVar1 = std::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    local_50 = std::_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_>::operator*
                         ((_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_> *)
                          in_stack_ffffffffffffff30);
    local_58 = tinyxml2::XMLDocument::NewElement
                         ((XMLDocument *)in_stack_ffffffffffffff40._M_current,
                          (char *)in_stack_ffffffffffffff38);
    tinyxml2::XMLElement::SetAttribute
              ((XMLElement *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38,
               (double)in_stack_ffffffffffffff30);
    tinyxml2::XMLElement::SetAttribute
              ((XMLElement *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38,
               (double)in_stack_ffffffffffffff30);
    tinyxml2::XMLElement::SetAttribute
              ((XMLElement *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38,
               (double)in_stack_ffffffffffffff30);
    tinyxml2::XMLElement::SetAttribute
              ((XMLElement *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38,
               (double)in_stack_ffffffffffffff30);
    tinyxml2::XMLNode::InsertEndChild
              (in_stack_ffffffffffffff38,(XMLNode *)in_stack_ffffffffffffff30);
    std::_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_> *)
               in_stack_ffffffffffffff30);
  }
  tinyxml2::XMLNode::InsertEndChild(in_stack_ffffffffffffff38,(XMLNode *)in_stack_ffffffffffffff30);
  local_30 = tinyxml2::XMLDocument::NewElement
                       ((XMLDocument *)in_stack_ffffffffffffff40._M_current,
                        (char *)in_stack_ffffffffffffff38);
  local_60 = &in_RCX[1].super_XMLNode._value._start;
  local_68._M_node =
       (_Base_ptr)
       std::
       map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
       ::begin(in_RDI);
  local_70._M_node =
       (_Base_ptr)
       std::
       map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
       ::end(in_RDI);
  while( true ) {
    bVar1 = std::operator!=(&local_68,&local_70);
    if (!bVar1) break;
    local_78 = std::_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_>::operator*
                         ((_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_> *)
                          in_stack_ffffffffffffff30);
    local_80 = tinyxml2::XMLDocument::NewElement
                         ((XMLDocument *)in_stack_ffffffffffffff40._M_current,
                          (char *)in_stack_ffffffffffffff38);
    tinyxml2::XMLElement::SetAttribute
              ((XMLElement *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38,
               (double)in_stack_ffffffffffffff30);
    tinyxml2::XMLElement::SetAttribute
              ((XMLElement *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38,
               (double)in_stack_ffffffffffffff30);
    tinyxml2::XMLElement::SetAttribute
              ((XMLElement *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38,
               (double)in_stack_ffffffffffffff30);
    tinyxml2::XMLElement::SetAttribute
              ((XMLElement *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38,
               (double)in_stack_ffffffffffffff30);
    tinyxml2::XMLNode::InsertEndChild
              (in_stack_ffffffffffffff38,(XMLNode *)in_stack_ffffffffffffff30);
    std::_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_> *)
               in_stack_ffffffffffffff30);
  }
  tinyxml2::XMLNode::InsertEndChild(in_stack_ffffffffffffff38,(XMLNode *)in_stack_ffffffffffffff30);
  local_30 = tinyxml2::XMLDocument::NewElement
                       ((XMLDocument *)in_stack_ffffffffffffff40._M_current,
                        (char *)in_stack_ffffffffffffff38);
  local_88 = &in_RCX[1].super_XMLNode._memPool;
  local_90._M_node =
       (_Base_ptr)
       std::
       map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
       ::begin(in_RDI);
  local_98._M_node =
       (_Base_ptr)
       std::
       map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
       ::end(in_RDI);
  while( true ) {
    bVar1 = std::operator!=(&local_90,&local_98);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_> *)
               in_stack_ffffffffffffff30);
    tinyxml2::XMLDocument::NewElement
              ((XMLDocument *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38
              );
    tinyxml2::XMLElement::SetAttribute
              ((XMLElement *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38,
               (double)in_stack_ffffffffffffff30);
    tinyxml2::XMLElement::SetAttribute
              ((XMLElement *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38,
               (double)in_stack_ffffffffffffff30);
    tinyxml2::XMLElement::SetAttribute
              ((XMLElement *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38,
               (double)in_stack_ffffffffffffff30);
    tinyxml2::XMLElement::SetAttribute
              ((XMLElement *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38,
               (double)in_stack_ffffffffffffff30);
    tinyxml2::XMLNode::InsertEndChild
              (in_stack_ffffffffffffff38,(XMLNode *)in_stack_ffffffffffffff30);
    std::_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_double,_CS248::Vector3D>_> *)
               in_stack_ffffffffffffff30);
  }
  tinyxml2::XMLNode::InsertEndChild(in_stack_ffffffffffffff38,(XMLNode *)in_stack_ffffffffffffff30);
  tinyxml2::XMLDocument::NewElement
            ((XMLDocument *)in_stack_ffffffffffffff40._M_current,(char *)in_stack_ffffffffffffff38);
  tinyxml2::XMLNode::InsertEndChild(in_stack_ffffffffffffff38,(XMLNode *)in_stack_ffffffffffffff30);
  std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>::begin
            ((vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_> *)
             in_RDI);
  std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>::end
            ((vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_> *)
             in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<CS248::DynamicScene::Joint_*const_*,_std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>_>
                        *)in_stack_ffffffffffffff30,
                       (__normal_iterator<CS248::DynamicScene::Joint_*const_*,_std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    ppJVar2 = __gnu_cxx::
              __normal_iterator<CS248::DynamicScene::Joint_*const_*,_std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>_>
              ::operator*((__normal_iterator<CS248::DynamicScene::Joint_*const_*,_std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>_>
                           *)&stack0xffffffffffffff40);
    in_stack_ffffffffffffff30 = *ppJVar2;
    saveJoint(in_RSI,in_RDX,in_RCX,joint_00);
    __gnu_cxx::
    __normal_iterator<CS248::DynamicScene::Joint_*const_*,_std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>_>
    ::operator++((__normal_iterator<CS248::DynamicScene::Joint_*const_*,_std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>_>
                  *)&stack0xffffffffffffff40);
  }
  return;
}

Assistant:

void Skeleton::saveJoint(XMLDocument* xmlDoc, XMLElement* parentNode,
                         const Joint* joint) {
  XMLElement* pJoint = xmlDoc->NewElement("Joint");
  parentNode->InsertEndChild(pJoint);

  XMLElement* pElement = xmlDoc->NewElement("Axis");
  pElement->SetAttribute("x", joint->axis.x);
  pElement->SetAttribute("y", joint->axis.y);
  pElement->SetAttribute("z", joint->axis.z);
  pJoint->InsertEndChild(pElement);

  pElement = xmlDoc->NewElement("RenderScale");
  pElement->SetAttribute("val", joint->renderScale);
  pJoint->InsertEndChild(pElement);

  pElement = xmlDoc->NewElement("CapsuleRadius");
  pElement->SetAttribute("val", joint->capsuleRadius);
  pJoint->InsertEndChild(pElement);

  // positions
  pElement = xmlDoc->NewElement("Positions");
  for (const auto& item : joint->positions.knots) {
    XMLElement* pListElement = xmlDoc->NewElement("Knot");
    pListElement->SetAttribute("Time", item.first);
    pListElement->SetAttribute("x", item.second.x);
    pListElement->SetAttribute("y", item.second.y);
    pListElement->SetAttribute("z", item.second.z);

    pElement->InsertEndChild(pListElement);
  }
  pJoint->InsertEndChild(pElement);

  // rotations
  pElement = xmlDoc->NewElement("Rotations");
  for (const auto& item : joint->rotations.knots) {
    XMLElement* pListElement = xmlDoc->NewElement("Knot");
    pListElement->SetAttribute("Time", item.first);
    pListElement->SetAttribute("x", item.second.x);
    pListElement->SetAttribute("y", item.second.y);
    pListElement->SetAttribute("z", item.second.z);

    pElement->InsertEndChild(pListElement);
  }
  pJoint->InsertEndChild(pElement);

  // scales
  pElement = xmlDoc->NewElement("Scales");
  for (const auto& item : joint->scales.knots) {
    XMLElement* pListElement = xmlDoc->NewElement("Knot");
    pListElement->SetAttribute("Time", item.first);
    pListElement->SetAttribute("x", item.second.x);
    pListElement->SetAttribute("y", item.second.y);
    pListElement->SetAttribute("z", item.second.z);

    pElement->InsertEndChild(pListElement);
  }
  pJoint->InsertEndChild(pElement);

  XMLElement* pChildren = xmlDoc->NewElement("Children");
  pJoint->InsertEndChild(pChildren);
  for (Joint* j : joint->kids) {
    saveJoint(xmlDoc, pChildren, j);
  }
}